

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

void __thiscall foxxll::request::check_nref_failed(request *this,bool after)

{
  int iVar1;
  undefined4 extraout_var;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  Logger local_190;
  
  tlx::Logger::Logger(&local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"WARNING: serious error, reference to the request is lost ",0x39)
  ;
  local_198 = "before";
  if (after) {
    local_198 = "after";
  }
  tlx::LoggerFormatter<const_char_*,_void>::print((ostream *)&local_190,&local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," serve()",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," nref=",6);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," this=",6);
  std::ostream::_M_insert<void_const*>(&local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," offset=",8);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," buffer=",8);
  std::ostream::_M_insert<void_const*>(&local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," bytes=",7);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," op=",4);
  local_1a0 = "WRITE";
  if (this->op_ == READ) {
    local_1a0 = "READ";
  }
  tlx::LoggerFormatter<const_char_*,_void>::print((ostream *)&local_190,&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," file=",6);
  std::ostream::_M_insert<void_const*>(&local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," iotype=",8);
  iVar1 = (*this->file_->_vptr_file[0xd])();
  local_1a8 = (char *)CONCAT44(extraout_var,iVar1);
  tlx::LoggerFormatter<const_char_*,_void>::print((ostream *)&local_190,&local_1a8);
  tlx::Logger::~Logger(&local_190);
  return;
}

Assistant:

void request::check_nref_failed(bool after)
{
    TLX_LOG1 << "WARNING: serious error, reference to the request is lost " <<
    (after ? "after" : "before") << " serve()" <<
        " nref=" << reference_count() <<
        " this=" << this <<
        " offset=" << offset_ <<
        " buffer=" << buffer_ <<
        " bytes=" << bytes_ <<
        " op=" << ((op_ == READ) ? "READ" : "WRITE") <<
        " file=" << file_ <<
        " iotype=" << file_->io_type();
}